

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaBlockMetadata_Linear::AddStatistics(VmaBlockMetadata_Linear *this,VmaStatistics *inoutStats)

{
  SECOND_VECTOR_MODE SVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  VkDeviceSize VVar5;
  bool bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t uVar10;
  void **ppvVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  VkDeviceSize VVar15;
  bool bVar16;
  
  bVar16 = this->m_1stVectorIndex == 0;
  bVar6 = !bVar16;
  uVar2 = (this->super_VmaBlockMetadata).m_Size;
  uVar3 = (&this->m_Suballocations0)[bVar6].m_Count;
  uVar8 = (&this->m_Suballocations0)[bVar16].m_Count;
  inoutStats->blockCount = inoutStats->blockCount + 1;
  inoutStats->blockBytes = inoutStats->blockBytes + uVar2;
  inoutStats->allocationBytes = inoutStats->allocationBytes + (uVar2 - this->m_SumFreeSize);
  SVar1 = this->m_2ndVectorMode;
  sVar12 = this->m_1stNullItemsBeginCount;
  if (SVar1 == SECOND_VECTOR_RING_BUFFER) {
    uVar4 = (&this->m_Suballocations0)[bVar6].m_pArray[sVar12].offset;
    if (uVar4 != 0) {
      uVar10 = inoutStats->allocationCount;
      sVar14 = sVar12;
      while (uVar9 = uVar4, sVar14 < uVar8) {
        ppvVar11 = &(&this->m_Suballocations0)[bVar16].m_pArray[sVar14].userData;
        while (sVar14 = sVar14 + 1, *ppvVar11 == (void *)0x0) {
          ppvVar11 = ppvVar11 + 4;
          if (sVar14 == uVar8) goto LAB_001b76fc;
        }
        VVar15 = ((VmaSuballocation *)(ppvVar11 + -2))->offset;
        uVar10 = uVar10 + 1;
        inoutStats->allocationCount = uVar10;
        uVar9 = VVar15 + (long)ppvVar11[-1];
        if (uVar4 <= uVar9) break;
      }
      goto LAB_001b76fc;
    }
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
LAB_001b76fc:
    if (SVar1 == SECOND_VECTOR_DOUBLE_STACK) {
      bVar7 = 1;
      VVar15 = (&this->m_Suballocations0)[bVar16].m_pArray[uVar8 - 1].offset;
      goto LAB_001b7725;
    }
  }
  bVar7 = 0;
  VVar15 = uVar2;
LAB_001b7725:
  if (uVar9 < VVar15) {
    uVar10 = inoutStats->allocationCount;
    while (uVar9 = VVar15, sVar12 < uVar3) {
      ppvVar11 = &(&this->m_Suballocations0)[bVar6].m_pArray[sVar12].userData;
      while (sVar12 = sVar12 + 1, *ppvVar11 == (void *)0x0) {
        ppvVar11 = ppvVar11 + 4;
        if (sVar12 == uVar3) goto LAB_001b7786;
      }
      VVar5 = ((VmaSuballocation *)(ppvVar11 + -2))->offset;
      uVar10 = uVar10 + 1;
      inoutStats->allocationCount = uVar10;
      uVar9 = VVar5 + (long)ppvVar11[-1];
      if (VVar15 <= uVar9) break;
    }
  }
LAB_001b7786:
  if ((bool)(bVar7 & uVar9 < uVar2)) {
    uVar10 = inoutStats->allocationCount;
    while (uVar8 != 0) {
      lVar13 = 1 - uVar8;
      ppvVar11 = &(&this->m_Suballocations0)[bVar16].m_pArray[uVar8 - 1].userData;
      while (*ppvVar11 == (void *)0x0) {
        lVar13 = lVar13 + 1;
        ppvVar11 = ppvVar11 + -4;
        if (lVar13 == 1) {
          return;
        }
      }
      VVar15 = ((VmaSuballocation *)(ppvVar11 + -2))->offset;
      uVar10 = uVar10 + 1;
      inoutStats->allocationCount = uVar10;
      uVar8 = -lVar13;
      if (uVar2 <= VVar15 + (long)ppvVar11[-1]) {
        return;
      }
    }
  }
  return;
}

Assistant:

const SuballocationVectorType& AccessSuballocations1st() const { return m_1stVectorIndex ? m_Suballocations1 : m_Suballocations0; }